

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2,TokenList *args_3)

{
  Info *pIVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  ConditionalBranchDirectiveSyntax *pCVar9;
  
  pCVar9 = (ConditionalBranchDirectiveSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalBranchDirectiveSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (ConditionalBranchDirectiveSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  TVar4 = args_1->kind;
  uVar5 = args_1->field_0x2;
  NVar6.raw = (args_1->numFlags).raw;
  uVar7 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pCVar9->super_DirectiveSyntax).super_SyntaxNode.kind = *args;
  (pCVar9->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar9->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar9->super_DirectiveSyntax).directive.kind = TVar4;
  (pCVar9->super_DirectiveSyntax).directive.field_0x2 = uVar5;
  (pCVar9->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar9->super_DirectiveSyntax).directive.rawLen = uVar7;
  (pCVar9->super_DirectiveSyntax).directive.info = pIVar1;
  (pCVar9->expr).ptr = args_2;
  uVar8 = *(undefined4 *)&(args_3->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (args_3->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_3->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_3->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pCVar9->disabledTokens).super_SyntaxListBase.childCount =
       (args_3->super_SyntaxListBase).childCount;
  sVar3 = (args_3->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pCVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args_3->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (pCVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pCVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c81b0;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pCVar9;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar9;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }